

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int anon_unknown.dwarf_17824::SMPI_Gatherv_Impl<long>
              (long *sendbuf,int sendcount,void *recvbuf,size_t *recvcounts,size_t *displs,
              SMPI_Datatype recvtype,int root,SMPI_Comm comm)

{
  long *sendbuf_00;
  Comm *in_RDX;
  int in_ESI;
  size_t in_RDI;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  string *in_stack_00000010;
  size_t *in_stack_fffffffffffffe18;
  string *this;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  long *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  long *in_stack_fffffffffffffe38;
  Comm *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [80];
  
  switch(in_R9D) {
  case 0:
    std::__cxx11::string::string(local_50);
    adios2::helper::Comm::Gatherv<long,int>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (int *)in_stack_fffffffffffffe28,
               (size_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_50);
    break;
  case 1:
    std::__cxx11::string::string(local_a0);
    adios2::helper::Comm::Gatherv<long,long>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28,
               (size_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe60,in_stack_00000010);
    std::__cxx11::string::~string(local_a0);
    break;
  case 2:
    sendbuf_00 = (long *)(long)in_ESI;
    this = local_c0;
    std::__cxx11::string::string(this);
    adios2::helper::Comm::Gatherv<long,unsigned_long>
              (in_RDX,sendbuf_00,in_RDI,(unsigned_long *)in_stack_00000010,
               (size_t *)CONCAT44(in_stack_00000008,in_stack_fffffffffffffe20),(size_t *)this,
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_c0);
    break;
  case 3:
    std::__cxx11::string::string(local_80);
    adios2::helper::Comm::Gatherv<long,char>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (char *)in_stack_fffffffffffffe28,
               (size_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_80);
    break;
  case 4:
    std::__cxx11::string::string(local_e0);
    adios2::helper::Comm::Gatherv<long,unsigned_char>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (uchar *)in_stack_fffffffffffffe28,
               (size_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_e0);
  }
  return 0;
}

Assistant:

int SMPI_Gatherv_Impl(const TSend *sendbuf, int sendcount, void *recvbuf, const size_t *recvcounts,
                      const size_t *displs, SMPI_Datatype recvtype, int root, SMPI_Comm comm)
{
    switch (recvtype)
    {
#define F(type)                                                                                    \
    comm->Gatherv(sendbuf, sendcount, static_cast<type *>(recvbuf), recvcounts, displs, root)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}